

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PerPatchDataCase::init
          (PerPatchDataCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  char *in_RCX;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_518;
  char *local_510;
  string local_4f0;
  ShaderSource local_4d0;
  string local_4a8;
  ShaderSource local_488;
  string local_460;
  ShaderSource local_440;
  string local_418;
  ShaderSource local_3f8;
  ProgramSources local_3d0;
  SharedPtr<const_glu::ShaderProgram> local_300;
  allocator<char> local_2e9;
  string local_2e8 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  byte local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  byte local_274;
  allocator<char> local_273;
  byte local_272;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  byte local_24c;
  allocator<char> local_24b;
  byte local_24a;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string tessellationEvaluationTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string tessellationControlTemplate;
  string local_80 [8];
  string vertexShaderTemplate;
  undefined1 local_50 [8];
  string outSizeStr;
  string inSizeStr;
  PerPatchDataCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  de::toString<int>((string *)((long)&outSizeStr.field_2 + 8),
                    &Functional::(anonymous_namespace)::PerPatchDataCase::INPUT_PATCH_SIZE);
  de::toString<int>((string *)local_50,
                    &Functional::(anonymous_namespace)::PerPatchDataCase::OUTPUT_PATCH_SIZE);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,(allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tessellationEvaluationTemplate.field_2 + 8),
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tessellationEvaluationTemplate.field_2 + 8),
                 ") out;\n\nin highp float in_tc_attr[];\n\nout highp float in_te_attr[];\n");
  if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TCS) {
    local_510 = "patch out mediump int in_te_primitiveIDFromTCS;\n";
  }
  else {
    local_510 = "";
    in_RCX = "patch out mediump int in_te_patchVerticesInFromTCS;\n";
    if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
      local_510 = "patch out mediump int in_te_patchVerticesInFromTCS;\n";
    }
  }
  std::operator+(&local_108,&local_128,local_510);
  std::operator+(&local_e8,&local_108,
                 "\nvoid main (void)\n{\n\tin_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
                );
  if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TCS) {
    local_518 = "\tin_te_primitiveIDFromTCS = gl_PrimitiveID;\n";
  }
  else {
    local_518 = "";
    in_RCX = "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n";
    if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
      local_518 = "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n";
    }
  }
  std::operator+(&local_c8,&local_e8,local_518);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_c8,
                 "\n\tgl_TessLevelInner[0] = 9.0;\n\tgl_TessLevelInner[1] = 8.0;\n\n\tgl_TessLevelOuter[0] = 7.0;\n\tgl_TessLevelOuter[1] = 6.0;\n\tgl_TessLevelOuter[2] = 5.0;\n\tgl_TessLevelOuter[3] = 4.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)(tessellationEvaluationTemplate.field_2._M_local_buf + 8))
  ;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_228,(_anonymous_namespace_ *)&DAT_00000001,TESSPRIMITIVETYPE_TRIANGLES,
             SUB81(in_RCX,0));
  std::operator+(&local_208,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",&local_228);
  std::operator+(&local_1e8,&local_208,"\nin highp float in_te_attr[];\n");
  local_24a = 0;
  local_24c = 0;
  if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TCS) {
    std::allocator<char>::allocator();
    local_24a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"patch in mediump int in_te_primitiveIDFromTCS;\n",&local_249);
  }
  else if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
    std::allocator<char>::allocator();
    local_24c = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"patch in mediump int in_te_patchVerticesInFromTCS;\n",
               &local_24b);
  }
  else {
    std::__cxx11::string::string((string *)&local_248);
  }
  std::operator+(&local_1c8,&local_1e8,&local_248);
  std::operator+(&local_1a8,&local_1c8,
                 "\nout mediump vec4 in_f_color;\n\nuniform highp float u_xScale;\n\nvoid main (void)\n{\n\thighp float x = (gl_TessCoord.x*u_xScale + in_te_attr[0]) * 2.0 - 1.0;\n\thighp float y = gl_TessCoord.y*2.0 - 1.0;\n\tgl_Position = vec4(x, y, 0.0, 1.0);\n"
                );
  local_272 = 0;
  local_274 = 0;
  local_299 = 0;
  fragmentShaderTemplate.field_2._M_local_buf[0xf] = '\0';
  fragmentShaderTemplate.field_2._M_local_buf[0xd] = '\0';
  if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TCS) {
    std::allocator<char>::allocator();
    local_272 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"\tbool ok = in_te_primitiveIDFromTCS == 3;\n",&local_271);
  }
  else if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TES) {
    std::allocator<char>::allocator();
    local_274 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"\tbool ok = gl_PrimitiveID == 3;\n",&local_273);
  }
  else if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
    std::operator+(&local_298,"\tbool ok = in_te_patchVerticesInFromTCS == ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&outSizeStr.field_2 + 8));
    local_299 = 1;
    std::operator+(&local_270,&local_298,";\n");
  }
  else if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TES) {
    std::operator+(&local_2c0,"\tbool ok = gl_PatchVerticesIn == ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    fragmentShaderTemplate.field_2._M_local_buf[0xf] = '\x01';
    std::operator+(&local_270,&local_2c0,";\n");
  }
  else {
    if (this->m_caseType == CASETYPE_TESS_LEVEL_INNER0_TES) {
      local_540 = "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n";
    }
    else {
      if (this->m_caseType == CASETYPE_TESS_LEVEL_INNER1_TES) {
        local_548 = "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n";
      }
      else {
        if (this->m_caseType == CASETYPE_TESS_LEVEL_OUTER0_TES) {
          local_550 = "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n";
        }
        else {
          if (this->m_caseType == CASETYPE_TESS_LEVEL_OUTER1_TES) {
            local_558 = "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n";
          }
          else {
            if (this->m_caseType == CASETYPE_TESS_LEVEL_OUTER2_TES) {
              local_560 = "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n";
            }
            else {
              local_560 = (char *)0x0;
              in_RCX = "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n";
              if (this->m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES) {
                local_560 = "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n";
              }
            }
            local_558 = local_560;
          }
          local_550 = local_558;
        }
        local_548 = local_550;
      }
      local_540 = local_548;
    }
    std::allocator<char>::allocator();
    fragmentShaderTemplate.field_2._M_local_buf[0xd] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_540,
               (allocator<char> *)(fragmentShaderTemplate.field_2._M_local_buf + 0xe));
  }
  std::operator+(&local_188,&local_1a8,&local_270);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 &local_188,"\tin_f_color = ok ? vec4(1.0) : vec4(vec3(0.0), 1.0);\n}\n");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_270);
  if ((fragmentShaderTemplate.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)(fragmentShaderTemplate.field_2._M_local_buf + 0xe));
  }
  if ((fragmentShaderTemplate.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((local_299 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((local_274 & 1) != 0) {
    std::allocator<char>::~allocator(&local_273);
  }
  if ((local_272 & 1) != 0) {
    std::allocator<char>::~allocator(&local_271);
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_248);
  if ((local_24c & 1) != 0) {
    std::allocator<char>::~allocator(&local_24b);
  }
  if ((local_24a & 1) != 0) {
    std::allocator<char>::~allocator(&local_249);
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_2e9);
  std::allocator<char>::~allocator(&local_2e9);
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_3d0);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_418,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&local_3f8,&local_418);
  pPVar6 = glu::ProgramSources::operator<<(&local_3d0,&local_3f8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_460,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_440,&local_460);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_440);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_4a8,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_488,&local_4a8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_488);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_4f0,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_4d0,&local_4f0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_4d0);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_300,pSVar4);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_300);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_300);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  glu::VertexSource::~VertexSource((VertexSource *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  glu::ProgramSources::~ProgramSources(&local_3d0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar4);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar4);
  if (bVar2) {
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)local_50);
    iVar3 = std::__cxx11::string::~string((string *)(outSizeStr.field_2._M_local_buf + 8));
    return iVar3;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xcb2);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void PerPatchDataCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	DE_ASSERT(OUTPUT_PATCH_SIZE < INPUT_PATCH_SIZE);

	const string inSizeStr		= de::toString(INPUT_PATCH_SIZE);
	const string outSizeStr		= de::toString(OUTPUT_PATCH_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch out mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch out mediump int in_te_patchVerticesInFromTCS;\n"
													  : "") +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tin_te_primitiveIDFromTCS = gl_PrimitiveID;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n"
													  : "") +
													 "\n"
													 "	gl_TessLevelInner[0] = 9.0;\n"
													 "	gl_TessLevelInner[1] = 8.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 7.0;\n"
													"	gl_TessLevelOuter[1] = 6.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 4.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch in mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch in mediump int in_te_patchVerticesInFromTCS;\n"
													  : string()) +
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform highp float u_xScale;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = (gl_TessCoord.x*u_xScale + in_te_attr[0]) * 2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y*2.0 - 1.0;\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tbool ok = in_te_primitiveIDFromTCS == 3;\n"
													  : m_caseType == CASETYPE_PRIMITIVE_ID_TES			? "\tbool ok = gl_PrimitiveID == 3;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tbool ok = in_te_patchVerticesInFromTCS == " + inSizeStr + ";\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TES	? "\tbool ok = gl_PatchVerticesIn == " + outSizeStr + ";\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER0_TES	? "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER1_TES	? "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER0_TES	? "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER1_TES	? "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER2_TES	? "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES	? "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n"
													  : DE_NULL) +
													  "	in_f_color = ok ? vec4(1.0) : vec4(vec3(0.0), 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}